

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamReaderPrivate::putStringLiteral(QXmlStreamReaderPrivate *this,QStringView s)

{
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  long lVar4;
  
  QXmlStreamSimpleStack<unsigned_int>::reserve(&this->putStack,s.m_size);
  puVar2 = (this->putStack).data;
  lVar3 = (this->putStack).tos;
  for (lVar4 = s.m_size * 2; lVar3 = lVar3 + 1, lVar4 != 0; lVar4 = lVar4 + -2) {
    uVar1 = *(ushort *)((long)s.m_data + lVar4 + -2);
    (this->putStack).tos = lVar3;
    puVar2[lVar3] = uVar1 | 0x1a0000;
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::putStringLiteral(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it)
        putStack.rawPush() = ((LETTER << 16) | it->unicode());
}